

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

long __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,long,duckdb::QuantileComposed<duckdb::MadAccessor<long,long,long>,duckdb::QuantileIndirect<long>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>
          *accessor)

{
  bool bVar1;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>_>
  __comp;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>_>
  __comp_00;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>_>
  __comp_01;
  RESULT_TYPE RVar2;
  long lVar3;
  long lVar4;
  undefined7 uStack_5f;
  undefined7 uStack_47;
  undefined7 uStack_2f;
  
  bVar1 = this->desc;
  if (this->CRN == this->FRN) {
    __comp._17_7_ = uStack_2f;
    __comp.desc = bVar1;
    __comp.accessor_r = accessor;
    __comp.accessor_l = accessor;
    ::std::
    nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<long,long,long>,duckdb::QuantileIndirect<long>>>>
              (v_t + this->begin,v_t + this->CRN,v_t + this->end,__comp);
    RVar2 = QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>
            ::operator()(accessor,v_t + this->FRN);
    lVar3 = Cast::Operation<long,long>(RVar2);
    return lVar3;
  }
  __comp_00._17_7_ = uStack_47;
  __comp_00.desc = bVar1;
  __comp_00.accessor_r = accessor;
  __comp_00.accessor_l = accessor;
  ::std::
  nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<long,long,long>,duckdb::QuantileIndirect<long>>>>
            (v_t + this->begin,v_t + this->FRN,v_t + this->end,__comp_00);
  __comp_01._17_7_ = uStack_5f;
  __comp_01.desc = bVar1;
  __comp_01.accessor_r = accessor;
  __comp_01.accessor_l = accessor;
  ::std::
  nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<long,long,long>,duckdb::QuantileIndirect<long>>>>
            (v_t + this->FRN,v_t + this->CRN,v_t + this->end,__comp_01);
  RVar2 = QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>::
          operator()(accessor,v_t + this->FRN);
  lVar3 = Cast::Operation<long,long>(RVar2);
  RVar2 = QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>::
          operator()(accessor,v_t + this->CRN);
  lVar4 = Cast::Operation<long,long>(RVar2);
  return (long)((double)(lVar4 - lVar3) *
                (this->RN -
                (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) + (double)lVar3
               );
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}